

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  uint uVar1;
  char *zRight;
  bool bVar2;
  uint uVar3;
  int iVar4;
  HashElem *pHVar5;
  Table *unaff_RBP;
  Table *pTVar6;
  uint uVar7;
  char *local_40;
  
  uVar1 = db->nDb;
  local_40 = zName;
  do {
    if (0 < (int)uVar1) {
      uVar7 = 0;
      pTVar6 = unaff_RBP;
      do {
        uVar3 = uVar7 < 2 ^ uVar7;
        if ((zDatabase == (char *)0x0) ||
           (iVar4 = sqlite3StrICmp(zDatabase,db->aDb[uVar3].zDbSName), iVar4 == 0)) {
          bVar2 = false;
          pHVar5 = findElementWithHash(&(db->aDb[uVar3].pSchema)->tblHash,local_40,(uint *)0x0);
          unaff_RBP = (Table *)pHVar5->data;
          if ((Table *)pHVar5->data == (Table *)0x0) goto LAB_0012c805;
        }
        else {
LAB_0012c805:
          bVar2 = true;
          unaff_RBP = pTVar6;
        }
        if (!bVar2) {
          return unaff_RBP;
        }
        uVar7 = uVar7 + 1;
        pTVar6 = unaff_RBP;
      } while (uVar1 != uVar7);
    }
    iVar4 = sqlite3StrICmp(local_40,"sqlite_master");
    if (iVar4 != 0) {
      return (Table *)0x0;
    }
    zRight = db->aDb[1].zDbSName;
    if (zDatabase == (char *)0x0) {
      iVar4 = -(uint)(zRight != (char *)0x0);
    }
    else if (zRight == (char *)0x0) {
      iVar4 = 1;
    }
    else {
      iVar4 = sqlite3StrICmp(zDatabase,zRight);
    }
    local_40 = "sqlite_temp_master";
    if (iVar4 != 0) {
      return (Table *)0x0;
    }
  } while( true );
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}